

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O3

int sc_jsf(int *u0,int *u1,limb_t *a,limb_t *b)

{
  bool bVar1;
  ulong uVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int *piVar12;
  long lVar13;
  
  lVar7 = 0;
  uVar4 = 0;
  uVar2 = 0;
  uVar6 = 0;
  piVar3 = u0;
  piVar12 = u1;
  do {
    uVar6 = uVar6 + a[lVar7];
    uVar2 = uVar2 + b[lVar7];
    uVar4 = uVar4 + 0x34;
    lVar13 = 0;
    do {
      iVar11 = 0;
      iVar8 = 0;
      uVar9 = (uint)uVar6 & 3;
      uVar5 = (uint)uVar2;
      if ((uVar6 & 3) != 0) {
        uVar10 = (uint)uVar6 & 7;
        if (((uVar10 == 5) || (uVar10 == 3)) && ((uVar5 & 3) == 2)) {
          iVar8 = uVar9 - 2;
        }
        else {
          iVar8 = 2 - uVar9;
        }
      }
      piVar3[lVar13] = iVar8;
      if ((uVar2 & 3) != 0) {
        if ((((uVar5 & 7) == 5) || ((uVar5 & 7) == 3)) && (uVar9 == 2)) {
          iVar11 = (uVar5 & 3) - 2;
        }
        else {
          iVar11 = 2 - (uVar5 & 3);
        }
      }
      piVar12[lVar13] = iVar11;
      uVar6 = (long)(uVar6 - (long)piVar3[lVar13]) >> 1;
      uVar2 = (long)(uVar2 - (long)iVar11) >> 1;
      lVar13 = lVar13 + 1;
    } while ((int)lVar13 != 0x34);
    lVar7 = lVar7 + 1;
    piVar12 = piVar12 + 0x34;
    piVar3 = piVar3 + 0x34;
  } while (lVar7 != 5);
  iVar11 = 0;
  iVar8 = 0;
  uVar9 = (uint)uVar6 & 3;
  uVar5 = (uint)uVar2;
  if ((uVar6 & 3) != 0) {
    uVar10 = (uint)uVar6 & 7;
    if (((uVar10 == 5) || (uVar10 == 3)) && ((uVar5 & 3) == 2)) {
      iVar8 = uVar9 - 2;
    }
    else {
      iVar8 = 2 - uVar9;
    }
  }
  u0[(int)uVar4] = iVar8;
  if ((uVar2 & 3) != 0) {
    if ((((uVar5 & 7) == 5) || ((uVar5 & 7) == 3)) && (uVar9 == 2)) {
      iVar11 = (uVar5 & 3) - 2;
    }
    else {
      iVar11 = 2 - (uVar5 & 3);
    }
  }
  u1[(int)uVar4] = iVar11;
  uVar5 = uVar4;
  if (-1 < (int)uVar4) {
    do {
      if (u0[uVar5] != 0) {
        return uVar5;
      }
      if (u1[uVar5] != 0) {
        return uVar5;
      }
      uVar4 = uVar5 - 1;
      bVar1 = 0 < (int)uVar5;
      uVar5 = uVar4;
    } while (bVar1);
  }
  return uVar4;
}

Assistant:

int
sc_jsf(int u0[SC_BITS+1], int u1[SC_BITS+1], const sc_t a, const sc_t b)
{
	limb_t n0, n1;
	int i, j, k;

	k = n0 = n1 = 0;

	for (i = 0; i < K; i++) {
		n0 += a[i];
		n1 += b[i];

		for (j = 0; j < LB; j++, k++) {
			u0[k] = jsfdigit(n0, n1);
			u1[k] = jsfdigit(n1, n0);

			n0 = (n0 - u0[k]) >> 1;
			n1 = (n1 - u1[k]) >> 1;
		}
	}
	u0[k] = jsfdigit(n0, n1);
	u1[k] = jsfdigit(n1, n0);

	while (k >= 0 && u0[k] == 0 && u1[k] == 0)
		k--;

	return k;
}